

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_GetIssuanceBlindingKey_Test::
~cfdcapi_elements_transaction_GetIssuanceBlindingKey_Test
          (cfdcapi_elements_transaction_GetIssuanceBlindingKey_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_elements_transaction_GetIssuanceBlindingKey_Test
            ((cfdcapi_elements_transaction_GetIssuanceBlindingKey_Test *)0x373228);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, GetIssuanceBlindingKey) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* blinding_key = nullptr;
  ret = CfdGetIssuanceBlindingKey(
    handle, "ac2c1e4cce122139bb25abc50599e09738143cc4bc96e55f399a5e1e45d916a9",
    "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 1,
    &blinding_key);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f", blinding_key);

    CfdFreeStringBuffer(blinding_key);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}